

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  int iVar7;
  uint32_t uVar8;
  size_t sVar9;
  size_t sVar10;
  BrotliEncoderDictionary *pBVar11;
  uint16_t *puVar12;
  uint32_t *puVar13;
  HasherCommon *pHVar14;
  size_t sVar15;
  size_t sVar16;
  PreparedDictionary *pPVar17;
  uint8_t *puVar18;
  BrotliDictionary *pBVar19;
  size_t sVar20;
  undefined8 uVar21;
  int iVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  ulong uVar29;
  ulong *puVar30;
  long lVar31;
  char *pcVar32;
  ulong uVar33;
  uint32_t uVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  uint *puVar40;
  undefined8 *puVar41;
  ulong uVar42;
  ulong *puVar43;
  int iVar44;
  byte bVar45;
  uint16_t uVar46;
  uint uVar47;
  int iVar48;
  ulong uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  ulong uVar54;
  uint8_t *s1_orig_2;
  size_t sVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  uint8_t *s1_orig;
  int last_distance;
  size_t sVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1a8;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  size_t local_180;
  ulong local_178;
  ulong local_170;
  ulong local_148;
  Command *local_140;
  uint local_11c;
  ulong local_118;
  ulong local_f8;
  
  iVar36 = params->lgwin;
  uVar4 = (position - 3) + num_bytes;
  sVar55 = position;
  if (3 < num_bytes) {
    sVar55 = uVar4;
  }
  lVar56 = 0x200;
  if (params->quality < 9) {
    lVar56 = 0x40;
  }
  sVar9 = params->stream_offset;
  local_180 = *last_insert_len;
  uVar1 = position + num_bytes;
  sVar10 = (params->dictionary).compound.total_size;
  uVar47 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
  if (4 < (int)uVar47) {
    iVar7 = *dist_cache;
    dist_cache[4] = iVar7 + -1;
    dist_cache[5] = iVar7 + 1;
    dist_cache[6] = iVar7 + -2;
    dist_cache[7] = iVar7 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar7 + 3,iVar7 + -3);
    if (10 < uVar47) {
      iVar7 = dist_cache[1];
      dist_cache[10] = iVar7 + -1;
      dist_cache[0xb] = iVar7 + 1;
      dist_cache[0xc] = iVar7 + -2;
      dist_cache[0xd] = iVar7 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar7 + 3,iVar7 + -3);
    }
  }
  uVar5 = (1L << ((byte)iVar36 & 0x3f)) - 0x10;
  uVar60 = lVar56 + position;
  lVar37 = sVar10 + 1;
  lVar3 = position - 1;
  local_140 = commands;
LAB_0033d9b5:
LAB_0033d9c3:
  uVar27 = position;
  if (uVar1 <= uVar27 + 4) {
    *last_insert_len = (local_180 + uVar1) - uVar27;
    *num_commands = *num_commands + ((long)local_140 - (long)commands >> 4);
    return;
  }
  uVar51 = uVar5;
  if (uVar27 < uVar5) {
    uVar51 = uVar27;
  }
  uVar26 = sVar9 + uVar27;
  if (uVar5 <= sVar9 + uVar27) {
    uVar26 = uVar5;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_11c = 0;
    local_f8 = 0;
    goto LAB_0033da6f;
  }
  if (uVar27 == 0) {
    local_f8 = 0;
LAB_0033da3e:
    uVar24 = 0;
  }
  else {
    local_f8 = (ulong)ringbuffer[uVar27 - 1 & ringbuffer_mask];
    if (uVar27 == 1) goto LAB_0033da3e;
    uVar24 = (ulong)ringbuffer[uVar27 - 2 & ringbuffer_mask];
  }
  local_11c = (uint)(params->dictionary).contextual.context_map
                    [literal_context_lut[uVar24 + 0x100] | literal_context_lut[local_f8]];
LAB_0033da6f:
  local_178 = uVar1 - uVar27;
  pBVar11 = (params->dictionary).contextual.dict[local_11c];
  uVar24 = (params->dist).max_distance;
  puVar12 = (hasher->privat)._H5.num_;
  puVar13 = (hasher->privat)._H5.buckets_;
  uVar38 = uVar27 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar38);
  uVar57 = 0x7e4;
  uVar25 = 0;
  uVar39 = 0;
  uVar54 = 0;
  uVar62 = 0;
  do {
    if (uVar54 == (long)(hasher->privat)._H5.num_last_distances_to_check_) {
      uVar53 = (uint)((int)*puVar2 * 0x1e35a7bd) >> (*(byte *)((long)&hasher->privat + 0x10) & 0x1f)
      ;
      uVar47 = uVar53 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      uVar6 = puVar12[uVar53];
      uVar58 = (ulong)uVar6;
      uVar54 = (hasher->privat)._H5.block_size_;
      uVar49 = 0;
      if (uVar54 <= uVar58) {
        uVar49 = uVar58 - uVar54;
      }
      uVar50 = (hasher->privat)._H5.block_mask_;
      do {
        local_1d0 = uVar57;
        uVar52 = uVar62;
        local_190 = uVar39;
        local_1a8 = uVar25;
        uVar29 = uVar52 + uVar38;
        do {
          do {
            do {
              do {
                if (uVar58 <= uVar49) {
LAB_0033dd5c:
                  puVar13[(ulong)uVar47 + (ulong)(uVar50 & uVar6)] = (uint32_t)uVar27;
                  puVar12[uVar53] = uVar6 + 1;
                  iVar36 = 0;
                  if (local_1d0 != 0x7e4) goto LAB_0033dfa5;
                  pHVar14 = (hasher->privat)._H5.common_;
                  uVar51 = pHVar14->dict_num_lookups;
                  local_1c8 = pHVar14->dict_num_matches;
                  if (uVar51 >> 7 <= local_1c8) {
                    uVar25 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar18 = pBVar11->hash_table_lengths;
                    iVar36 = 0;
                    local_1d0 = 0x7e4;
                    lVar61 = 0;
                    goto LAB_0033de15;
                  }
                  local_1d0 = 0x7e4;
                  goto LAB_0033dfa5;
                }
                uVar58 = uVar58 - 1;
                uVar25 = uVar27 - puVar13[(ulong)uVar47 + (ulong)((uint)uVar58 & uVar50)];
                if (uVar51 < uVar25) goto LAB_0033dd5c;
              } while (ringbuffer_mask < uVar29);
              uVar62 = (ulong)(puVar13[(ulong)uVar47 + (ulong)((uint)uVar58 & uVar50)] &
                              (uint)ringbuffer_mask);
              uVar39 = uVar62 + uVar52;
            } while ((ringbuffer_mask < uVar39) || (ringbuffer[uVar29] != ringbuffer[uVar39]));
            puVar30 = (ulong *)(ringbuffer + uVar62);
            lVar61 = 0;
            puVar43 = puVar2;
            uVar62 = local_178;
LAB_0033dce0:
            if (uVar62 < 8) {
              for (uVar39 = 0;
                  (uVar62 != uVar39 &&
                  (*(char *)((long)puVar30 + uVar39) == *(char *)((long)puVar43 + uVar39)));
                  uVar39 = uVar39 + 1) {
              }
            }
            else {
              if (*puVar43 == *puVar30) goto code_r0x0033dcf1;
              uVar62 = *puVar30 ^ *puVar43;
              uVar39 = 0;
              if (uVar62 != 0) {
                for (; (uVar62 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar39 = uVar39 >> 3 & 0x1fffffff;
            }
            uVar39 = uVar39 - lVar61;
          } while (uVar39 < 4);
          iVar36 = 0x1f;
          if ((uint)uVar25 != 0) {
            for (; (uint)uVar25 >> iVar36 == 0; iVar36 = iVar36 + -1) {
            }
          }
          uVar57 = (ulong)(iVar36 * -0x1e + 0x780) + uVar39 * 0x87;
          uVar62 = uVar39;
        } while (uVar57 <= local_1d0);
      } while( true );
    }
    uVar49 = (ulong)dist_cache[uVar54];
    if (((uVar49 <= uVar51) && (uVar27 - uVar49 < uVar27)) && (uVar38 + uVar62 <= ringbuffer_mask))
    {
      uVar29 = uVar27 - uVar49 & ringbuffer_mask;
      uVar58 = uVar29 + uVar62;
      if ((uVar58 <= ringbuffer_mask) && (ringbuffer[uVar38 + uVar62] == ringbuffer[uVar58])) {
        puVar30 = (ulong *)(ringbuffer + uVar29);
        lVar61 = 0;
        uVar58 = local_178;
        puVar43 = puVar2;
LAB_0033db3a:
        if (uVar58 < 8) {
          for (uVar29 = 0;
              (uVar58 != uVar29 &&
              (*(char *)((long)puVar30 + uVar29) == *(char *)((long)puVar43 + uVar29)));
              uVar29 = uVar29 + 1) {
          }
        }
        else {
          if (*puVar43 == *puVar30) goto code_r0x0033db4c;
          uVar29 = *puVar30 ^ *puVar43;
          uVar58 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
            }
          }
          uVar29 = uVar58 >> 3 & 0x1fffffff;
        }
        uVar29 = uVar29 - lVar61;
        if (((2 < uVar29) || ((uVar54 < 2 && (uVar29 == 2)))) &&
           (uVar58 = uVar29 * 0x87 + 0x78f, uVar57 < uVar58)) {
          if (uVar54 != 0) {
            uVar58 = uVar58 - ((0x1ca10U >> ((byte)uVar54 & 0xe) & 0xe) + 0x27);
          }
          if (uVar57 < uVar58) {
            uVar25 = uVar49;
            uVar39 = uVar29;
            uVar62 = uVar29;
            uVar57 = uVar58;
          }
        }
      }
    }
    uVar54 = uVar54 + 1;
  } while( true );
LAB_0033de15:
  if (lVar61 == 2) goto LAB_0033dfa5;
  uVar51 = uVar51 + 1;
  pHVar14->dict_num_lookups = uVar51;
  bVar28 = puVar18[uVar25];
  uVar39 = (ulong)bVar28;
  if ((uVar39 != 0) && (uVar39 <= local_178)) {
    pBVar19 = pBVar11->words;
    puVar30 = (ulong *)(pBVar19->data +
                       (ulong)pBVar19->offsets_by_length[uVar39] +
                       pBVar11->hash_table_words[uVar25] * uVar39);
    lVar31 = 0;
    uVar62 = uVar39;
    puVar43 = puVar2;
LAB_0033de7f:
    if (uVar62 < 8) {
      for (uVar62 = 0;
          ((bVar28 & 7) != uVar62 &&
          (*(char *)((long)puVar43 + uVar62) == *(char *)((long)puVar30 + uVar62)));
          uVar62 = uVar62 + 1) {
      }
    }
    else {
      if (*puVar30 == *puVar43) goto code_r0x0033de90;
      uVar57 = *puVar43 ^ *puVar30;
      uVar62 = 0;
      if (uVar57 != 0) {
        for (; (uVar57 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
        }
      }
      uVar62 = uVar62 >> 3 & 0x1fffffff;
    }
    uVar62 = uVar62 - lVar31;
    if (((uVar62 != 0) && (uVar39 < pBVar11->cutoffTransformsCount + uVar62)) &&
       (uVar39 = (ulong)pBVar11->hash_table_words[uVar25] + lVar37 + uVar26 +
                 ((ulong)((uint)(pBVar11->cutoffTransforms >>
                                ((char)(uVar39 - uVar62) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar39 - uVar62) * 4 << (pBVar19->size_bits_by_length[uVar39] & 0x3f)),
       uVar39 <= uVar24)) {
      iVar7 = 0x1f;
      if ((uint)uVar39 != 0) {
        for (; (uint)uVar39 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar57 = (uVar62 * 0x87 - (ulong)(uint)(iVar7 * 0x1e)) + 0x780;
      if (local_1d0 <= uVar57) {
        iVar36 = (uint)bVar28 - (int)uVar62;
        local_1c8 = local_1c8 + 1;
        pHVar14->dict_num_matches = local_1c8;
        local_1d0 = uVar57;
        local_190 = uVar62;
        local_1a8 = uVar39;
      }
    }
  }
  lVar61 = lVar61 + 1;
  uVar25 = uVar25 + 1;
  goto LAB_0033de15;
LAB_0033dfa5:
  sVar15 = (params->dictionary).compound.num_chunks;
  sVar16 = (params->dictionary).compound.total_size;
  sVar59 = 0;
LAB_0033dfca:
  if (sVar59 != sVar15) {
    pPVar17 = (params->dictionary).compound.chunks[sVar59];
    bVar28 = (byte)pPVar17->bucket_bits;
    bVar45 = (byte)pPVar17->slot_bits;
    bVar23 = -(char)pPVar17->hash_bits;
    uVar51 = ((*puVar2 << (bVar23 & 0x3f)) >> (bVar23 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar28 & 0x3f);
    lVar61 = (1L << (bVar45 & 0x3f)) * 4;
    lVar31 = (1L << (bVar28 & 0x3f)) * 2;
    bVar45 = -bVar45;
    uVar47 = (uint)*(ushort *)((long)&pPVar17[1].magic + (uVar51 & 0xffffffff) * 2 + lVar61);
    puVar41 = (undefined8 *)
              ((long)&pPVar17[1].magic + (ulong)pPVar17->num_items * 4 + lVar31 + lVar61);
    if (pPVar17->magic != 0xdebcede0) {
      puVar41 = (undefined8 *)*puVar41;
    }
    uVar39 = (uVar26 + sVar16) - (params->dictionary).compound.chunk_offsets[sVar59];
    uVar25 = (ulong)pPVar17->source_size;
    puVar40 = (uint *)((long)&pPVar17[1].magic +
                      (ulong)(uVar47 + (&pPVar17[1].magic)
                                       [(uint)((int)uVar51 << (bVar45 & 0x1f)) >> (bVar45 & 0x1f)])
                      * 4 + lVar31 + lVar61);
    uVar47 = (uint)(uVar47 == 0xffff);
    lVar61 = 0;
    local_1d8 = local_190;
    local_1c8 = local_1d0;
    do {
      if (lVar61 == 4) {
        do {
          do {
            do {
              do {
                if (uVar47 != 0) {
                  sVar59 = sVar59 + 1;
                  goto LAB_0033dfca;
                }
                uVar47 = *puVar40;
                puVar40 = puVar40 + 1;
                uVar62 = (ulong)(uVar47 & 0x7fffffff);
                uVar47 = uVar47 & 0x80000000;
                uVar57 = uVar39 - uVar62;
                uVar51 = uVar25 - uVar62;
                if (local_178 <= uVar25 - uVar62) {
                  uVar51 = local_178;
                }
              } while ((((uVar24 < uVar57) || (ringbuffer_mask < uVar38 + local_1d8)) ||
                       (uVar51 <= local_1d8)) ||
                      (ringbuffer[uVar38 + local_1d8] !=
                       *(uint8_t *)((long)puVar41 + local_1d8 + uVar62)));
              lVar61 = (long)puVar41 + uVar62;
              uVar58 = 0;
              lVar31 = 0;
              uVar49 = uVar51;
              puVar43 = puVar2;
LAB_0033e278:
              if (7 < uVar49) {
                if (*puVar43 == *(ulong *)(lVar61 + uVar58)) goto code_r0x0033e28a;
                uVar62 = *(ulong *)(lVar61 + uVar58) ^ *puVar43;
                uVar51 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar51 = (uVar51 >> 3 & 0x1fffffff) - lVar31;
                goto LAB_0033e2d8;
              }
              lVar31 = uVar62 + uVar51 + (long)puVar41;
              for (; uVar51 != uVar58; uVar58 = uVar58 + 1) {
                if (*(char *)(lVar61 + uVar58) != *(char *)((long)puVar2 + uVar58)) {
                  lVar31 = uVar58 + lVar61;
                  break;
                }
              }
              uVar51 = lVar31 - lVar61;
LAB_0033e2d8:
            } while (uVar51 < 4);
            iVar7 = 0x1f;
            if ((uint)uVar57 != 0) {
              for (; (uint)uVar57 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            uVar62 = (ulong)(iVar7 * -0x1e + 0x780) + uVar51 * 0x87;
          } while (uVar62 <= local_1c8);
          iVar36 = 0;
          local_1d8 = uVar51;
          local_1d0 = uVar62;
          local_1c8 = uVar62;
          local_1a8 = uVar57;
          local_190 = uVar51;
        } while( true );
      }
      uVar51 = (ulong)dist_cache[lVar61];
      if ((uVar39 - uVar25 < uVar51) && (lVar31 = uVar39 - uVar51, uVar51 <= uVar39)) {
        uVar62 = uVar25 - lVar31;
        if (local_178 <= uVar25 - lVar31) {
          uVar62 = local_178;
        }
        uVar49 = 0;
        uVar57 = uVar62;
LAB_0033e0f5:
        if (uVar57 < 8) {
          for (pcVar32 = (char *)((long)puVar41 + uVar49 + lVar31);
              (uVar62 != uVar49 && (*pcVar32 == *(char *)((long)puVar2 + uVar49)));
              pcVar32 = pcVar32 + 1) {
            uVar49 = uVar49 + 1;
          }
        }
        else {
          uVar58 = *(ulong *)((long)puVar41 + uVar49 + lVar31);
          if (*(ulong *)((long)puVar2 + uVar49) == uVar58) goto code_r0x0033e108;
          uVar58 = uVar58 ^ *(ulong *)((long)puVar2 + uVar49);
          uVar62 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
            }
          }
          uVar49 = uVar49 + (uVar62 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar49) && (uVar62 = uVar49 * 0x87 + 0x78f, local_1c8 < uVar62)) {
          if (lVar61 != 0) {
            uVar62 = uVar62 - ((0x1ca10U >> ((byte)lVar61 & 2) & 4) + 0x27);
          }
          if (local_1c8 < uVar62) {
            if (local_1d8 < uVar49) {
              local_1d8 = uVar49;
            }
            iVar36 = 0;
            local_1a8 = uVar51;
            local_190 = uVar49;
            local_1d0 = uVar62;
            local_1c8 = uVar62;
          }
        }
      }
      lVar61 = lVar61 + 1;
    } while( true );
  }
  if (local_1d0 < 0x7e5) {
    local_180 = local_180 + 1;
    position = uVar27 + 1;
    if (uVar60 < position) {
      if (uVar60 + (uint)((int)lVar56 * 4) < position) {
        uVar51 = uVar27 + 0x11;
        if (uVar1 - 4 <= uVar27 + 0x11) {
          uVar51 = uVar1 - 4;
        }
        for (; position < uVar51; position = position + 4) {
          uVar47 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
          uVar6 = puVar12[uVar47];
          puVar13[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar6) +
                  (ulong)(uVar47 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] =
               (uint32_t)position;
          puVar12[uVar47] = uVar6 + 1;
          local_180 = local_180 + 4;
        }
      }
      else {
        uVar51 = uVar27 + 9;
        if (uVar4 <= uVar27 + 9) {
          uVar51 = uVar4;
        }
        for (; position < uVar51; position = position + 2) {
          uVar47 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
          uVar6 = puVar12[uVar47];
          puVar13[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar6) +
                  (ulong)(uVar47 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] =
               (uint32_t)position;
          puVar12[uVar47] = uVar6 + 1;
          local_180 = local_180 + 2;
        }
      }
    }
    goto LAB_0033d9c3;
  }
  iVar7 = (hasher->privat)._H5.num_last_distances_to_check_;
  uVar34 = (hasher->privat)._H35.hb.state;
  uVar47 = (hasher->privat)._H5.block_mask_;
  uVar8 = (hasher->privat)._H6.block_mask_;
  uVar51 = local_180 + 4;
  uVar60 = sVar9 + 1 + uVar27;
  local_148 = (lVar3 + num_bytes) - uVar27;
  iVar44 = 0;
LAB_0033e4f6:
  uVar26 = uVar5;
  if (uVar60 < uVar5) {
    uVar26 = uVar60;
  }
  local_178 = local_178 - 1;
  uVar25 = local_190 - 1;
  if (local_178 <= local_190 - 1) {
    uVar25 = local_178;
  }
  if (4 < params->quality) {
    uVar25 = 0;
  }
  uVar39 = uVar27 + 1;
  uVar62 = uVar5;
  if (uVar39 < uVar5) {
    uVar62 = uVar39;
  }
  local_118 = sVar9 + uVar27 + 1;
  if (uVar5 <= local_118) {
    local_118 = uVar5;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_11c = (uint)(params->dictionary).contextual.context_map
                      [literal_context_lut[local_f8 + 0x100] |
                       literal_context_lut[ringbuffer[uVar27 & ringbuffer_mask]]];
    local_f8 = (ulong)ringbuffer[uVar27 & ringbuffer_mask];
  }
  pBVar11 = (params->dictionary).contextual.dict[local_11c];
  uVar29 = uVar39 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar29);
  uVar49 = 0x7e4;
  uVar57 = 0;
  uVar38 = 0;
  uVar58 = 0;
  do {
    if (uVar58 == (long)iVar7) {
      uVar50 = (uint)((int)*puVar2 * 0x1e35a7bd) >> ((byte)uVar34 & 0x1f);
      uVar53 = uVar50 << ((byte)uVar8 & 0x1f);
      uVar6 = puVar12[uVar50];
      uVar52 = (ulong)uVar6;
      uVar58 = 0;
      if (uVar54 <= uVar52) {
        uVar58 = uVar52 - uVar54;
      }
      do {
        local_1e0 = uVar49;
        uVar33 = uVar25;
        local_198 = uVar38;
        local_170 = uVar57;
        uVar42 = uVar33 + uVar29;
        do {
          do {
            do {
              do {
                if (uVar52 <= uVar58) {
LAB_0033e87e:
                  puVar13[(ulong)uVar53 + (ulong)(uVar47 & uVar6)] = (uint32_t)uVar39;
                  puVar12[uVar50] = uVar6 + 1;
                  iVar48 = 0;
                  if (local_1e0 != 0x7e4) goto LAB_0033eac5;
                  pHVar14 = (hasher->privat)._H5.common_;
                  uVar25 = pHVar14->dict_num_lookups;
                  local_188 = pHVar14->dict_num_matches;
                  if (uVar25 >> 7 <= local_188) {
                    uVar62 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar18 = pBVar11->hash_table_lengths;
                    local_1e0 = 0x7e4;
                    iVar48 = 0;
                    lVar61 = 0;
                    goto LAB_0033e940;
                  }
                  local_1e0 = 0x7e4;
                  goto LAB_0033eac5;
                }
                uVar52 = uVar52 - 1;
                uVar57 = uVar39 - puVar13[(ulong)uVar53 +
                                          (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar52)];
                if (uVar62 < uVar57) goto LAB_0033e87e;
              } while (ringbuffer_mask < uVar42);
              uVar38 = (ulong)(puVar13[(ulong)uVar53 +
                                       (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar52)] &
                              (uint)ringbuffer_mask);
              uVar25 = uVar38 + uVar33;
            } while ((ringbuffer_mask < uVar25) || (ringbuffer[uVar42] != ringbuffer[uVar25]));
            puVar30 = (ulong *)(ringbuffer + uVar38);
            lVar61 = 0;
            puVar43 = puVar2;
            uVar25 = local_178;
LAB_0033e7fd:
            if (uVar25 < 8) {
              for (uVar38 = 0;
                  (uVar25 != uVar38 &&
                  (*(char *)((long)puVar30 + uVar38) == *(char *)((long)puVar43 + uVar38)));
                  uVar38 = uVar38 + 1) {
              }
            }
            else {
              if (*puVar43 == *puVar30) goto code_r0x0033e80e;
              uVar38 = *puVar30 ^ *puVar43;
              uVar25 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar38 = uVar25 >> 3 & 0x1fffffff;
            }
            uVar38 = uVar38 - lVar61;
          } while (uVar38 < 4);
          iVar48 = 0x1f;
          if ((uint)uVar57 != 0) {
            for (; (uint)uVar57 >> iVar48 == 0; iVar48 = iVar48 + -1) {
            }
          }
          uVar49 = (ulong)(iVar48 * -0x1e + 0x780) + uVar38 * 0x87;
          uVar25 = uVar38;
        } while (uVar49 <= local_1e0);
      } while( true );
    }
    uVar52 = (ulong)dist_cache[uVar58];
    if (((uVar52 <= uVar62) && (uVar39 - uVar52 < uVar39)) && (uVar29 + uVar25 <= ringbuffer_mask))
    {
      uVar33 = uVar39 - uVar52 & ringbuffer_mask;
      uVar42 = uVar33 + uVar25;
      if ((uVar42 <= ringbuffer_mask) && (ringbuffer[uVar29 + uVar25] == ringbuffer[uVar42])) {
        puVar30 = (ulong *)(ringbuffer + uVar33);
        lVar61 = 0;
        uVar42 = local_178;
        puVar43 = puVar2;
LAB_0033e65e:
        if (uVar42 < 8) {
          for (uVar33 = 0;
              (uVar42 != uVar33 &&
              (*(char *)((long)puVar30 + uVar33) == *(char *)((long)puVar43 + uVar33)));
              uVar33 = uVar33 + 1) {
          }
        }
        else {
          if (*puVar43 == *puVar30) goto code_r0x0033e66f;
          uVar33 = *puVar30 ^ *puVar43;
          uVar42 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar33 = uVar42 >> 3 & 0x1fffffff;
        }
        uVar33 = uVar33 - lVar61;
        if (((2 < uVar33) || ((uVar58 < 2 && (uVar33 == 2)))) &&
           (uVar42 = uVar33 * 0x87 + 0x78f, uVar49 < uVar42)) {
          if (uVar58 != 0) {
            uVar42 = uVar42 - ((0x1ca10U >> ((byte)uVar58 & 0xe) & 0xe) + 0x27);
          }
          if (uVar49 < uVar42) {
            uVar57 = uVar52;
            uVar38 = uVar33;
            uVar25 = uVar33;
            uVar49 = uVar42;
          }
        }
      }
    }
    uVar58 = uVar58 + 1;
  } while( true );
code_r0x0033e28a:
  puVar43 = puVar43 + 1;
  uVar49 = uVar49 - 8;
  lVar31 = lVar31 + -8;
  uVar58 = uVar58 + 8;
  goto LAB_0033e278;
code_r0x0033e108:
  uVar57 = uVar57 - 8;
  uVar49 = uVar49 + 8;
  goto LAB_0033e0f5;
LAB_0033e940:
  if (lVar61 == 2) goto LAB_0033eac5;
  uVar25 = uVar25 + 1;
  pHVar14->dict_num_lookups = uVar25;
  bVar28 = puVar18[uVar62];
  uVar57 = (ulong)bVar28;
  if ((uVar57 != 0) && (uVar57 <= local_178)) {
    pBVar19 = pBVar11->words;
    puVar30 = (ulong *)(pBVar19->data +
                       (ulong)pBVar19->offsets_by_length[uVar57] +
                       pBVar11->hash_table_words[uVar62] * uVar57);
    lVar31 = 0;
    puVar43 = puVar2;
    uVar38 = uVar57;
LAB_0033e9aa:
    if (uVar38 < 8) {
      for (uVar38 = 0;
          ((bVar28 & 7) != uVar38 &&
          (*(char *)((long)puVar43 + uVar38) == *(char *)((long)puVar30 + uVar38)));
          uVar38 = uVar38 + 1) {
      }
    }
    else {
      if (*puVar30 == *puVar43) goto code_r0x0033e9bb;
      uVar49 = *puVar43 ^ *puVar30;
      uVar38 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar38 = uVar38 >> 3 & 0x1fffffff;
    }
    uVar38 = uVar38 - lVar31;
    if (((uVar38 != 0) && (uVar57 < pBVar11->cutoffTransformsCount + uVar38)) &&
       (uVar57 = (ulong)pBVar11->hash_table_words[uVar62] + lVar37 + local_118 +
                 ((ulong)((uint)(pBVar11->cutoffTransforms >>
                                ((char)(uVar57 - uVar38) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar57 - uVar38) * 4 << (pBVar19->size_bits_by_length[uVar57] & 0x3f)),
       uVar57 <= uVar24)) {
      iVar22 = 0x1f;
      if ((uint)uVar57 != 0) {
        for (; (uint)uVar57 >> iVar22 == 0; iVar22 = iVar22 + -1) {
        }
      }
      uVar49 = (uVar38 * 0x87 - (ulong)(uint)(iVar22 * 0x1e)) + 0x780;
      if (local_1e0 <= uVar49) {
        iVar48 = (uint)bVar28 - (int)uVar38;
        local_188 = local_188 + 1;
        pHVar14->dict_num_matches = local_188;
        local_1e0 = uVar49;
        local_170 = uVar57;
        local_198 = uVar38;
      }
    }
  }
  lVar61 = lVar61 + 1;
  uVar62 = uVar62 + 1;
  goto LAB_0033e940;
LAB_0033eac5:
  sVar59 = 0;
LAB_0033eb05:
  if (sVar59 != sVar15) {
    pPVar17 = (params->dictionary).compound.chunks[sVar59];
    bVar28 = (byte)pPVar17->bucket_bits;
    bVar45 = (byte)pPVar17->slot_bits;
    bVar23 = -(char)pPVar17->hash_bits;
    uVar25 = ((*puVar2 << (bVar23 & 0x3f)) >> (bVar23 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar28 & 0x3f);
    lVar61 = (1L << (bVar45 & 0x3f)) * 4;
    lVar31 = (1L << (bVar28 & 0x3f)) * 2;
    bVar45 = -bVar45;
    uVar53 = (uint)*(ushort *)((long)&pPVar17[1].magic + (uVar25 & 0xffffffff) * 2 + lVar61);
    puVar41 = (undefined8 *)
              ((long)&pPVar17[1].magic + (ulong)pPVar17->num_items * 4 + lVar31 + lVar61);
    if (pPVar17->magic != 0xdebcede0) {
      puVar41 = (undefined8 *)*puVar41;
    }
    sVar20 = (params->dictionary).compound.chunk_offsets[sVar59];
    uVar57 = (local_118 + sVar16) - sVar20;
    uVar62 = (ulong)pPVar17->source_size;
    puVar40 = (uint *)((long)&pPVar17[1].magic +
                      (ulong)(uVar53 + (&pPVar17[1].magic)
                                       [(uint)((int)uVar25 << (bVar45 & 0x1f)) >> (bVar45 & 0x1f)])
                      * 4 + lVar31 + lVar61);
    uVar53 = (uint)(uVar53 == 0xffff);
    lVar61 = 0;
    local_1d8 = local_1e0;
    local_188 = local_198;
    do {
      if (lVar61 == 4) {
        do {
          do {
            do {
              do {
                if (uVar53 != 0) {
                  sVar59 = sVar59 + 1;
                  goto LAB_0033eb05;
                }
                uVar53 = *puVar40;
                puVar40 = puVar40 + 1;
                uVar49 = (ulong)(uVar53 & 0x7fffffff);
                uVar53 = uVar53 & 0x80000000;
                uVar38 = uVar57 - uVar49;
                uVar25 = uVar62 - uVar49;
                if (local_178 <= uVar62 - uVar49) {
                  uVar25 = local_178;
                }
              } while ((((uVar24 < uVar38) || (ringbuffer_mask < uVar29 + local_188)) ||
                       (uVar25 <= local_188)) ||
                      (ringbuffer[uVar29 + local_188] !=
                       *(uint8_t *)((long)puVar41 + local_188 + uVar49)));
              puVar30 = (ulong *)(uVar49 + (long)puVar41);
              lVar61 = 0;
              puVar43 = puVar2;
LAB_0033edd6:
              if (uVar25 < 8) {
                for (uVar49 = 0;
                    (uVar25 != uVar49 &&
                    (*(char *)((long)puVar30 + uVar49) == *(char *)((long)puVar43 + uVar49)));
                    uVar49 = uVar49 + 1) {
                }
              }
              else {
                if (*puVar43 == *puVar30) goto code_r0x0033ede7;
                uVar49 = *puVar30 ^ *puVar43;
                uVar25 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar49 = uVar25 >> 3 & 0x1fffffff;
              }
              uVar49 = uVar49 - lVar61;
            } while (uVar49 < 4);
            iVar22 = 0x1f;
            if ((uint)uVar38 != 0) {
              for (; (uint)uVar38 >> iVar22 == 0; iVar22 = iVar22 + -1) {
              }
            }
            uVar25 = (ulong)(iVar22 * -0x1e + 0x780) + uVar49 * 0x87;
          } while (uVar25 <= local_1d8);
          iVar48 = 0;
          local_188 = uVar49;
          local_1e0 = uVar25;
          local_1d8 = uVar25;
          local_198 = uVar49;
          local_170 = uVar38;
        } while( true );
      }
      uVar25 = (ulong)dist_cache[lVar61];
      if ((uVar57 - uVar62 < uVar25) && (uVar25 <= uVar57)) {
        uVar38 = (uVar25 - uVar57) + uVar62;
        if (local_178 <= uVar38) {
          uVar38 = local_178;
        }
        lVar31 = ((uVar26 + sVar16) - sVar20) - uVar25;
        uVar49 = 0;
LAB_0033ec64:
        if (uVar38 < 8) {
          pcVar32 = (char *)((long)puVar41 + uVar49 + lVar31);
          uVar38 = sVar20 + (-uVar26 - sVar16) + uVar62 + uVar25;
          if (local_148 < uVar38) {
            uVar38 = local_148;
          }
          for (; (uVar38 != uVar49 && (*pcVar32 == *(char *)((long)puVar2 + uVar49)));
              pcVar32 = pcVar32 + 1) {
            uVar49 = uVar49 + 1;
          }
        }
        else {
          uVar58 = *(ulong *)((long)puVar41 + uVar49 + lVar31);
          if (*(ulong *)((long)puVar2 + uVar49) == uVar58) goto code_r0x0033ec78;
          uVar58 = uVar58 ^ *(ulong *)((long)puVar2 + uVar49);
          uVar38 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar49 = uVar49 + (uVar38 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar49) && (uVar38 = uVar49 * 0x87 + 0x78f, local_1d8 < uVar38)) {
          if (lVar61 != 0) {
            uVar38 = uVar38 - ((0x1ca10U >> ((byte)lVar61 & 2) & 4) + 0x27);
          }
          if (local_1d8 < uVar38) {
            if (local_188 < uVar49) {
              local_188 = uVar49;
            }
            iVar48 = 0;
            local_170 = uVar25;
            local_198 = uVar49;
            local_1e0 = uVar38;
            local_1d8 = uVar38;
          }
        }
      }
      lVar61 = lVar61 + 1;
    } while( true );
  }
  if (local_1e0 < local_1d0 + 0xaf) {
    local_198 = local_190;
    uVar39 = uVar27;
    iVar48 = iVar36;
    sVar59 = local_180;
    local_118 = uVar27 + sVar9;
    if (uVar5 <= uVar27 + sVar9) {
      local_118 = uVar5;
    }
    goto LAB_0033ef6a;
  }
  local_1a8 = local_170;
  sVar59 = uVar51;
  if (iVar44 == 3) goto LAB_0033ef6a;
  local_180 = local_180 + 1;
  iVar44 = iVar44 + 1;
  uVar26 = uVar27 + 5;
  uVar60 = uVar60 + 1;
  local_148 = local_148 - 1;
  local_1d0 = local_1e0;
  uVar27 = uVar39;
  local_190 = local_198;
  sVar59 = local_180;
  iVar36 = iVar48;
  if (uVar1 <= uVar26) goto LAB_0033ef6a;
  goto LAB_0033e4f6;
code_r0x0033ede7:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  uVar25 = uVar25 - 8;
  lVar61 = lVar61 + -8;
  goto LAB_0033edd6;
code_r0x0033ec78:
  uVar38 = uVar38 - 8;
  uVar49 = uVar49 + 8;
  goto LAB_0033ec64;
LAB_0033ef6a:
  local_180 = sVar59;
  local_118 = local_118 + sVar10;
  if (local_118 < local_1a8) {
LAB_0033ef8e:
    uVar60 = local_1a8 + 0xf;
  }
  else {
    if (local_1a8 == (long)*dist_cache) {
      uVar60 = 0;
      goto LAB_0033f01d;
    }
    uVar60 = 1;
    if (local_1a8 != (long)dist_cache[1]) {
      uVar60 = (local_1a8 + 3) - (long)*dist_cache;
      if (uVar60 < 7) {
        bVar28 = (byte)((int)uVar60 << 2);
        uVar47 = 0x9750468;
      }
      else {
        uVar60 = (local_1a8 + 3) - (long)dist_cache[1];
        if (6 < uVar60) {
          uVar60 = 2;
          if ((local_1a8 != (long)dist_cache[2]) && (uVar60 = 3, local_1a8 != (long)dist_cache[3]))
          goto LAB_0033ef8e;
          goto LAB_0033ef92;
        }
        bVar28 = (byte)((int)uVar60 << 2);
        uVar47 = 0xfdb1ace;
      }
      uVar60 = (ulong)(uVar47 >> (bVar28 & 0x1f) & 0xf);
    }
  }
LAB_0033ef92:
  if ((local_1a8 <= local_118) && (uVar60 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar21 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar21;
    iVar36 = (int)local_1a8;
    *dist_cache = iVar36;
    uVar47 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
    if (4 < (int)uVar47) {
      dist_cache[4] = iVar36 + -1;
      dist_cache[5] = iVar36 + 1;
      dist_cache[6] = iVar36 + -2;
      dist_cache[7] = iVar36 + 2;
      dist_cache[8] = iVar36 + -3;
      dist_cache[9] = iVar36 + 3;
      if (10 < uVar47) {
        iVar36 = (int)uVar21;
        dist_cache[10] = iVar36 + -1;
        dist_cache[0xb] = iVar36 + 1;
        dist_cache[0xc] = iVar36 + -2;
        dist_cache[0xd] = iVar36 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar36 + 3,iVar36 + -3);
      }
    }
  }
LAB_0033f01d:
  uVar47 = (uint)local_180;
  local_140->insert_len_ = uVar47;
  local_140->copy_len_ = iVar48 << 0x19 | (uint)local_198;
  uVar51 = (ulong)(params->dist).num_direct_distance_codes;
  uVar27 = uVar51 + 0x10;
  uVar34 = 0;
  if (uVar27 <= uVar60) {
    uVar53 = (params->dist).distance_postfix_bits;
    bVar28 = (byte)uVar53;
    uVar51 = ((4L << (bVar28 & 0x3f)) + (uVar60 - uVar51)) - 0x10;
    uVar50 = 0x1f;
    uVar35 = (uint)uVar51;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar50 == 0; uVar50 = uVar50 - 1) {
      }
    }
    uVar50 = (uVar50 ^ 0xffffffe0) + 0x1f;
    uVar26 = (ulong)((uVar51 >> ((ulong)uVar50 & 0x3f) & 1) != 0);
    lVar61 = (ulong)uVar50 - (ulong)uVar53;
    uVar60 = (~(-1 << (bVar28 & 0x1f)) & uVar35) + uVar27 +
             (uVar26 + lVar61 * 2 + 0xfffe << (bVar28 & 0x3f)) | lVar61 * 0x400;
    uVar34 = (uint32_t)(uVar51 - (uVar26 + 2 << ((byte)uVar50 & 0x3f)) >> (bVar28 & 0x3f));
  }
  local_140->dist_prefix_ = (uint16_t)uVar60;
  local_140->dist_extra_ = uVar34;
  if (5 < local_180) {
    if (local_180 < 0x82) {
      uVar47 = 0x1f;
      uVar53 = (uint)(local_180 - 2);
      if (uVar53 != 0) {
        for (; uVar53 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar47 = (int)(local_180 - 2 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar47 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_180 < 0x842) {
      uVar53 = 0x1f;
      if (uVar47 - 0x42 != 0) {
        for (; uVar47 - 0x42 >> uVar53 == 0; uVar53 = uVar53 - 1) {
        }
      }
      uVar47 = (uVar53 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar47 = 0x15;
      if (0x1841 < local_180) {
        uVar47 = (uint)(ushort)(0x17 - (local_180 < 0x5842));
      }
    }
  }
  uVar53 = iVar48 + (uint)local_198;
  if (uVar53 < 10) {
    uVar50 = uVar53 - 2;
  }
  else if (uVar53 < 0x86) {
    uVar53 = uVar53 - 6;
    uVar50 = 0x1f;
    if (uVar53 != 0) {
      for (; uVar53 >> uVar50 == 0; uVar50 = uVar50 - 1) {
      }
    }
    uVar50 = (uVar53 >> ((char)(uVar50 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar50 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar50 = 0x17;
    if (uVar53 < 0x846) {
      uVar50 = 0x1f;
      if (uVar53 - 0x46 != 0) {
        for (; uVar53 - 0x46 >> uVar50 == 0; uVar50 = uVar50 - 1) {
        }
      }
      uVar50 = (uVar50 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar50;
  uVar46 = (uVar6 & 7) + ((ushort)uVar47 & 7) * 8;
  if ((((uVar60 & 0x3ff) == 0) && ((ushort)uVar47 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar46 = uVar46 + 0x40;
    }
  }
  else {
    iVar36 = ((uVar47 & 0xffff) >> 3) * 3 + ((uVar50 & 0xffff) >> 3);
    uVar46 = uVar46 + ((ushort)(0x520d40 >> ((char)iVar36 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar36 * 0x40 + 0x40;
  }
  local_140->cmd_prefix_ = uVar46;
  *num_literals = *num_literals + local_180;
  position = local_198 + uVar39;
  uVar27 = sVar55;
  if (position < sVar55) {
    uVar27 = position;
  }
  uVar51 = uVar39 + 2;
  if (local_1a8 < local_198 >> 2) {
    uVar60 = position + local_1a8 * -4;
    if (uVar60 < uVar51) {
      uVar60 = uVar51;
    }
    uVar51 = uVar60;
    if (uVar27 < uVar60) {
      uVar51 = uVar27;
    }
  }
  uVar60 = uVar39 + lVar56 + local_198 * 2;
  local_140 = local_140 + 1;
  for (; uVar51 < uVar27; uVar51 = uVar51 + 1) {
    uVar47 = (uint)(*(int *)(ringbuffer + (uVar51 & ringbuffer_mask)) * 0x1e35a7bd) >>
             (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
    uVar6 = puVar12[uVar47];
    puVar13[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar6) +
            (ulong)(uVar47 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] = (uint32_t)uVar51;
    puVar12[uVar47] = uVar6 + 1;
  }
  local_180 = 0;
  goto LAB_0033d9b5;
code_r0x0033e9bb:
  puVar30 = puVar30 + 1;
  puVar43 = puVar43 + 1;
  uVar38 = uVar38 - 8;
  lVar31 = lVar31 + -8;
  goto LAB_0033e9aa;
code_r0x0033e80e:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  uVar25 = uVar25 - 8;
  lVar61 = lVar61 + -8;
  goto LAB_0033e7fd;
code_r0x0033e66f:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  uVar42 = uVar42 - 8;
  lVar61 = lVar61 + -8;
  goto LAB_0033e65e;
code_r0x0033de90:
  puVar30 = puVar30 + 1;
  puVar43 = puVar43 + 1;
  uVar62 = uVar62 - 8;
  lVar31 = lVar31 + -8;
  goto LAB_0033de7f;
code_r0x0033dcf1:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  uVar62 = uVar62 - 8;
  lVar61 = lVar61 + -8;
  goto LAB_0033dce0;
code_r0x0033db4c:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  uVar58 = uVar58 - 8;
  lVar61 = lVar61 + -8;
  goto LAB_0033db3a;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}